

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O2

void amrex::WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  MultiFab *src;
  bool bVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  long lVar4;
  int level;
  long lVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  const_iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FabArray<amrex::FArrayBox> *pFVar9;
  undefined1 local_17c [4];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  string ed;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_e0;
  element_type *local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_a8;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  PreBuildDirectorHierarchy
            (plotfilename,(string *)CONCAT44(in_register_00000034,nlevels),nlevels,false);
  __rhs = (extra_dirs->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    for (; __rhs != pbVar1; __rhs = __rhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     plotfilename,"/");
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
      std::operator+(&ed,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178,__rhs);
      std::__cxx11::string::~string((string *)local_178);
      PreBuildDirectorHierarchy(&ed,pbVar7,nlevels,false);
      std::__cxx11::string::~string((string *)&ed);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == *(int *)(ParallelContext::frames + 0x10) + -1) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)nlevels,(allocator_type *)&ed);
    lVar4 = 0;
    for (lVar5 = 0;
        lVar5 < ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                CONCAT44(boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)boxArrays.
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)) / 0x68; lVar5 = lVar5 + 1)
    {
      BoxArray::operator=((BoxArray *)
                          (CONCAT44(boxArrays.
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)boxArrays.
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         .
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start) + lVar4),
                          &((mf->
                            super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ).
                            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar5]->
                           super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
      lVar4 = lVar4 + 0x68;
    }
    std::__cxx11::string::string((string *)&ed,(string *)plotfilename);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&local_110,&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f8,
             &varnames->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              (&local_e0,&geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
    local_c8 = (element_type *)time;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_c0,&level_steps->super_vector<int,_std::allocator<int>_>);
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              (&local_a8,&ref_ratio->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>);
    std::__cxx11::string::string(local_90,(string *)versionName);
    std::__cxx11::string::string(local_70,(string *)levelPrefix);
    std::__cxx11::string::string(local_50,(string *)mfPrefix);
    bVar2 = AsyncOut::UseAsyncOut();
    if (bVar2) {
      local_168._0_8_ = 0;
      local_168._8_8_ = 0;
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = 0;
      pFVar3 = (FabArray<amrex::FArrayBox> *)operator_new(0x108);
      std::__cxx11::string::string((string *)pFVar3,(string *)&ed);
      (pFVar3->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = nlevels;
      *(pointer *)((long)&(pFVar3->super_FabArrayBase).boxarray.m_bat.m_op + 0x1c) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)&(pFVar3->super_FabArrayBase).boxarray.m_bat.m_op + 0x24) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)((long)&(pFVar3->super_FabArrayBase).boxarray.m_bat.m_op + 0x2c) =
           local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_110.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((pFVar3->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_doilo.vect + 2),
               &local_f8);
      std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
                ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                 &(pFVar3->super_FabArrayBase).boxarray.m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_e0
                );
      (pFVar3->super_FabArrayBase).distributionMap.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_c8;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &(pFVar3->super_FabArrayBase).distributionMap.m_ref.
                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_c0);
      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 &(pFVar3->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,&local_a8);
      std::__cxx11::string::string
                ((string *)
                 &(pFVar3->super_FabArrayBase).ownership.super__Bvector_base<std::allocator<bool>_>.
                  _M_impl.super__Bvector_impl_data._M_finish,local_90);
      std::__cxx11::string::string
                ((string *)((pFVar3->super_FabArrayBase).n_grow.vect + 2),local_70);
      std::__cxx11::string::string
                ((string *)((pFVar3->super_FabArrayBase).n_filled.vect + 2),local_50);
      local_168._8_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp:196:18)>
           ::_M_invoke;
      local_168._0_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp:196:18)>
           ::_M_manager;
      local_178._0_8_ = pFVar3;
      AsyncOut::Submit((function<void_()> *)local_178);
      std::_Function_base::~_Function_base((_Function_base *)local_178);
    }
    else {
      WriteMultiLevelPlotfile::anon_class_264_11_18691074::operator()
                ((anon_class_264_11_18691074 *)&ed);
    }
    WriteMultiLevelPlotfile(std::__cxx11::string_const&,int,amrex::Vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,amrex::Vector<amrex::Geometry,std::allocator<amrex::Geometry>>const&,double,amrex::Vector<int,std::allocator<int>>const&,amrex::Vector<amrex::IntVect,std::allocator<amrex::IntVect>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::~__0((__0 *)&ed);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
  }
  uVar6 = 0;
  uVar8 = (ulong)(uint)nlevels;
  if (nlevels < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    bVar2 = AsyncOut::UseAsyncOut();
    pFVar3 = &(mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
              super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6]->super_FabArray<amrex::FArrayBox>;
    if (bVar2) {
      MultiFabFileFullPrefix(&ed,(int)uVar6,plotfilename,levelPrefix,mfPrefix);
      VisMF::AsyncWrite(pFVar3,&ed,true);
      std::__cxx11::string::~string((string *)&ed);
    }
    else {
      if ((*(long *)(pFVar3->super_FabArrayBase).n_grow.vect == 0) &&
         ((pFVar3->super_FabArrayBase).n_grow.vect[2] == 0)) {
        pFVar9 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      else {
        boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (pFVar3->super_FabArrayBase).n_comp;
        local_17c = (undefined1  [4])0x0;
        ed._M_dataplus._M_p = (pointer)0x1;
        ed.field_2._8_8_ = 0;
        ed._M_string_length = 0;
        ed.field_2._M_allocated_capacity = 0;
        std::
        make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
                  ((BoxArray *)local_178,
                   (DistributionMapping *)&(pFVar3->super_FabArrayBase).boxarray,
                   (int *)&(pFVar3->super_FabArrayBase).distributionMap,(int *)&boxArrays,
                   (MFInfo *)local_17c,(FabFactory<amrex::FArrayBox> *)&ed);
        pFVar3 = (FabArray<amrex::FArrayBox> *)local_178._0_8_;
        local_178._0_8_ = (FabArray<amrex::FArrayBox> *)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ed.field_2);
        src = (mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
              super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6];
        MultiFab::Copy((MultiFab *)pFVar3,src,0,0,
                       (src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0);
        pFVar9 = pFVar3;
      }
      MultiFabFileFullPrefix(&ed,(int)uVar6,plotfilename,levelPrefix,mfPrefix);
      VisMF::Write(pFVar3,&ed,NFiles,false);
      std::__cxx11::string::~string((string *)&ed);
      if (pFVar9 != (FabArray<amrex::FArrayBox> *)0x0) {
        (*(pFVar9->super_FabArrayBase)._vptr_FabArrayBase[1])(pFVar9);
      }
    }
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                         const Vector<const MultiFab*>& mf,
                         const Vector<std::string>& varnames,
                         const Vector<Geometry>& geom, Real time,
                         const Vector<int>& level_steps,
                         const Vector<IntVect>& ref_ratio,
                         const std::string &versionName,
                         const std::string &levelPrefix,
                         const std::string &mfPrefix,
                         const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::MyProc() == ParallelDescriptor::NProcs()-1) {
        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        auto f = [=]() {
            VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
            std::string HeaderFileName(plotfilename + "/Header");
            std::ofstream HeaderFile;
            HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) FileOpenFailed(HeaderFileName);
            WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                       geom, time, level_steps, ref_ratio, versionName,
                                       levelPrefix, mfPrefix);
        };

        if (AsyncOut::UseAsyncOut()) {
            AsyncOut::Submit(std::move(f));
        } else {
            f();
        }
    }

    for (int level = 0; level <= finest_level; ++level)
    {
        if (AsyncOut::UseAsyncOut()) {
            VisMF::AsyncWrite(*mf[level],
                              MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix),
                              true);
        } else {
            const MultiFab* data;
            std::unique_ptr<MultiFab> mf_tmp;
            if (mf[level]->nGrowVect() != 0) {
                mf_tmp = std::make_unique<MultiFab>(mf[level]->boxArray(),
                                                    mf[level]->DistributionMap(),
                                                    mf[level]->nComp(), 0, MFInfo(),
                                                    mf[level]->Factory());
                MultiFab::Copy(*mf_tmp, *mf[level], 0, 0, mf[level]->nComp(), 0);
                data = mf_tmp.get();
            } else {
                data = mf[level];
            }
            VisMF::Write(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
        }
    }
}